

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O2

void __thiscall GeneticAlgorithm::run(GeneticAlgorithm *this)

{
  GeneticAlgorithm *in_RSI;
  ulong uVar1;
  Population p;
  Population local_a0;
  Population local_68;
  
  createBasePopulation(&local_a0,in_RSI);
  Population::process(&local_a0);
  std::vector<Population,_std::allocator<Population>_>::push_back(&this->generations,&local_a0);
  for (uVar1 = 0; uVar1 < params.generations; uVar1 = uVar1 + 1) {
    Population::tournament_selection(&local_68,&local_a0,(int)uVar1 + 1);
    Population::operator=(&local_a0,&local_68);
    std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_68.chromosomes);
    Population::crossover_selection(&local_a0,params.crossoverPercent);
    Population::mutation(&local_a0,params.mutationPercent);
    Population::process(&local_a0);
    Population::calcDiversity(&local_a0);
    std::vector<Population,_std::allocator<Population>_>::push_back(&this->generations,&local_a0);
  }
  Population::printBestCandidate
            ((this->generations).super__Vector_base<Population,_std::allocator<Population>_>._M_impl
             .super__Vector_impl_data._M_finish + -1);
  resultAsJson(this);
  std::vector<Chromosome,_std::allocator<Chromosome>_>::~vector(&local_a0.chromosomes);
  return;
}

Assistant:

void GeneticAlgorithm::run() {


    Population p = createBasePopulation();
    p.process();
    generations.push_back(p);

    double fitness = 0.001;
    int generation = 0;

    while(generation < params.generations){
        //p.printChromos();
        generation++;
        p = p.tournament_selection(generation);
        p.crossover_selection(params.crossoverPercent);
        p.mutation(params.mutationPercent);
        p.process();

        p.calcDiversity();
        //p.printBestCandidate();
       // std::cout << "Min Fitness: " << p.minFitness << std::endl;
       // std::cout << "Max Fitness: " << p.maxFitness << std::endl;

        generations.push_back(p);
     }

    generations.back().printBestCandidate();

    //resultToFile();
    resultAsJson();
}